

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qapplication.cpp
# Opt level: O2

bool QApplicationPrivate::updateTouchPointsForWidget(QWidget *widget,QTouchEvent *touchEvent)

{
  char cVar1;
  long *plVar2;
  int i;
  ulong uVar3;
  bool bVar4;
  long in_FS_OFFSET;
  qreal in_XMM1_Qa;
  QPointF QVar5;
  QPointF local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  bVar4 = false;
  for (uVar3 = 0; uVar3 < *(ulong *)(touchEvent + 0x38); uVar3 = uVar3 + 1) {
    plVar2 = (long *)QPointerEvent::point((longlong)touchEvent);
    local_48.xp = (qreal)QEventPoint::globalPosition();
    local_48.yp = in_XMM1_Qa;
    QVar5 = QWidget::mapFromGlobal(widget,&local_48);
    in_XMM1_Qa = QVar5.yp;
    *(QPointF *)(*plVar2 + 0x30) = QVar5;
    cVar1 = QEventPoint::state();
    bVar4 = (bool)(bVar4 | cVar1 == '\x01');
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar4;
  }
  __stack_chk_fail();
}

Assistant:

bool QApplicationPrivate::updateTouchPointsForWidget(QWidget *widget, QTouchEvent *touchEvent)
{
    bool containsPress = false;

    for (int i = 0; i < touchEvent->pointCount(); ++i) {
        auto &pt = touchEvent->point(i);
        QMutableEventPoint::setPosition(pt, widget->mapFromGlobal(pt.globalPosition()));

        if (pt.state() == QEventPoint::State::Pressed)
            containsPress = true;
    }
    return containsPress;
}